

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChMatrix33<double>::Get_A_Rxyz
          (ChVector<double> *__return_storage_ptr__,ChMatrix33<double> *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 uVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [56];
  
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (this->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  auVar8 = vxorpd_avx512vl(auVar11,auVar8);
  uVar3 = vcmpsd_avx512f(auVar11,ZEXT816(0xbff0000000000000),1);
  bVar5 = (bool)((byte)uVar3 & 1);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (ulong)bVar5 * 0x3ff0000000000000 + (ulong)!bVar5 * auVar8._0_8_;
  auVar8 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar13);
  dVar9 = asin(auVar8._0_8_);
  __return_storage_ptr__->m_data[1] = dVar9;
  local_38._8_8_ = 0;
  local_38._0_8_ =
       (this->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar10 = cos(dVar9);
  auVar8 = vunpcklpd_avx(*(undefined1 (*) [16])
                          ((this->super_Matrix<double,_3,_3,_1,_3,_3>).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 5),local_38);
  auVar12._0_8_ = cos(dVar9);
  auVar12._8_56_ = extraout_var;
  auVar7._8_8_ = extraout_XMM0_Qb;
  auVar7._0_8_ = dVar10;
  auVar1 = vunpcklpd_avx(auVar12._0_16_,auVar7);
  auVar8 = vdivpd_avx(auVar8,auVar1);
  auVar14._8_8_ = 0x3ff0000000000000;
  auVar14._0_8_ = 0x3ff0000000000000;
  auVar8 = vminpd_avx(auVar14,auVar8);
  auVar1._8_8_ = &DAT_bff0000000000000;
  auVar1._0_8_ = &DAT_bff0000000000000;
  uVar2 = vcmppd_avx512vl(auVar8,auVar1,1);
  auVar1 = vshufpd_avx(auVar8,auVar8,1);
  uVar6 = (uVar2 & 3) >> 1;
  bVar4 = (byte)(uVar2 & 3);
  dVar9 = asin((double)(uVar6 * -0x4010000000000000 + (ulong)!SUB81(uVar6,0) * auVar1._0_8_));
  __return_storage_ptr__->m_data[2] = dVar9;
  dVar9 = asin((double)((ulong)(bVar4 & 1) * -0x4010000000000000 +
                       (ulong)!(bool)(bVar4 & 1) * auVar8._0_8_));
  __return_storage_ptr__->m_data[0] = dVar9;
  return __return_storage_ptr__;
}

Assistant:

inline ChVector<Real> ChMatrix33<Real>::Get_A_Rxyz() const {
    ChVector<Real> Rxyz;

    Real arg1 = -(*this)(0, 2);
    if (arg1 > 1)
        arg1 = 1;
    if (arg1 < -1)
        arg1 = -1;

    Rxyz.y() = std::asin(arg1);

    Real arg2 = (*this)(0, 1) / std::cos(Rxyz.y());
    if (arg2 > 1)
        arg2 = 1;
    if (arg2 < -1)
        arg2 = -1;
    Real arg3 = (*this)(1, 2) / std::cos(Rxyz.y());
    if (arg3 > 1)
        arg3 = 1;
    if (arg3 < -1)
        arg3 = -1;

    Rxyz.z() = std::asin(arg2);
    Rxyz.x() = std::asin(arg3);

    return Rxyz;
}